

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docs.cpp
# Opt level: O1

void __thiscall docs::DocsParser::createDoc(DocsParser *this,Doc *doc)

{
  Token *pTVar1;
  TextPos *pTVar2;
  int iVar3;
  int iVar4;
  Token *pTVar5;
  Token *pTVar6;
  LexData *pLVar7;
  pointer puVar8;
  int iVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  TokenKind TVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  string type;
  string id;
  Token commentTok;
  string local_118;
  Doc *local_f8;
  undefined1 local_f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  Token local_48;
  
  pTVar1 = &this->tok;
  pTVar2 = &(this->tok).pos;
  local_f8 = doc;
switchD_00107c10_caseD_5:
  while( true ) {
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_f0 + 0x10);
    pTVar5 = (this->tok_it)._M_current;
    pTVar6 = (this->tok_end)._M_current;
    if (pTVar5 == pTVar6) {
      (this->tok).kind = Eof;
      pTVar2->line = 0;
      pTVar2->col = 0;
      (this->tok).i = 0;
      (this->tok).j = 0;
    }
    else {
      (this->tok).j = pTVar5->j;
      iVar3 = (pTVar5->pos).line;
      uVar12 = *(undefined8 *)&(pTVar5->pos).col;
      pTVar1->kind = pTVar5->kind;
      (pTVar1->pos).line = iVar3;
      *(undefined8 *)&(this->tok).pos.col = uVar12;
      (this->tok_it)._M_current = pTVar5 + 1;
    }
    TVar11 = pTVar1->kind;
    if (TVar11 == Comment) break;
LAB_00107be4:
    if (TVar11 == Eof) {
      return;
    }
  }
  local_48.j = (this->tok).j;
  local_48.kind = pTVar1->kind;
  local_48.pos.line = (pTVar1->pos).line;
  local_48._8_8_ = *(undefined8 *)&(this->tok).pos.col;
  pTVar5 = (this->tok_it)._M_current;
  if (pTVar5 == pTVar6) {
    pTVar1->kind = Eof;
    pTVar2->line = 0;
    pTVar2->col = 0;
    (this->tok).i = 0;
    (this->tok).j = 0;
  }
  else {
    (this->tok).j = pTVar5->j;
    iVar3 = (pTVar5->pos).line;
    uVar12 = *(undefined8 *)&(pTVar5->pos).col;
    pTVar1->kind = pTVar5->kind;
    (pTVar1->pos).line = iVar3;
    *(undefined8 *)&(this->tok).pos.col = uVar12;
    (this->tok_it)._M_current = pTVar5 + 1;
  }
  TVar11 = pTVar1->kind;
  if (TVar11 == Identifier) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    pTVar5 = (this->tok_it)._M_current;
    if (pTVar5 == pTVar6) {
      pTVar1->kind = Eof;
      pTVar2->line = 0;
      pTVar2->col = 0;
      (this->tok).i = 0;
      (this->tok).j = 0;
    }
    else {
      (this->tok).j = pTVar5->j;
      iVar3 = (pTVar5->pos).line;
      uVar12 = *(undefined8 *)&(pTVar5->pos).col;
      pTVar1->kind = pTVar5->kind;
      (pTVar1->pos).line = iVar3;
      *(undefined8 *)&(this->tok).pos.col = uVar12;
      (this->tok_it)._M_current = pTVar5 + 1;
    }
    if ((((this->tok).kind == Punctuator) && ((this->tok).i == 0x3a)) && ((this->tok).j == 0x3a)) {
      std::__cxx11::string::append((char *)&local_118);
      pTVar5 = (this->tok_it)._M_current;
      if (pTVar5 == (this->tok_end)._M_current) {
        pTVar1->kind = Eof;
        pTVar2->line = 0;
        pTVar2->col = 0;
        (this->tok).i = 0;
        (this->tok).j = 0;
      }
      else {
        (this->tok).j = pTVar5->j;
        iVar3 = (pTVar5->pos).line;
        uVar12 = *(undefined8 *)&(pTVar5->pos).col;
        pTVar1->kind = pTVar5->kind;
        (pTVar1->pos).line = iVar3;
        *(undefined8 *)&(this->tok).pos.col = uVar12;
        (this->tok_it)._M_current = pTVar5 + 1;
      }
    }
    if (pTVar1->kind != Identifier) {
      error<char_const(&)[21]>(this,(char (*) [21])"expecting identifier");
    }
    puVar8 = (this->data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_f0._0_8_ = paVar10;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)local_f0,puVar8 + (this->tok).i,puVar8 + (this->tok).j);
    std::__cxx11::string::_M_append((char *)&local_118,local_f0._0_8_);
    while( true ) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._0_8_ != paVar10) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
      pTVar5 = (this->tok_it)._M_current;
      if (pTVar5 == (this->tok_end)._M_current) {
        pTVar1->kind = Eof;
        pTVar2->line = 0;
        pTVar2->col = 0;
        (this->tok).i = 0;
        (this->tok).j = 0;
      }
      else {
        (this->tok).j = pTVar5->j;
        iVar3 = (pTVar5->pos).line;
        uVar12 = *(undefined8 *)&(pTVar5->pos).col;
        pTVar1->kind = pTVar5->kind;
        (pTVar1->pos).line = iVar3;
        *(undefined8 *)&(this->tok).pos.col = uVar12;
        (this->tok_it)._M_current = pTVar5 + 1;
      }
      if ((((this->tok).kind != Punctuator) || ((this->tok).i != 0x3a)) || ((this->tok).j != 0x3a))
      break;
      std::__cxx11::string::append((char *)&local_118);
      pTVar5 = (this->tok_it)._M_current;
      if (pTVar5 == (this->tok_end)._M_current) {
        pTVar1->kind = Eof;
        pTVar2->line = 0;
        pTVar2->col = 0;
        (this->tok).i = 0;
        (this->tok).j = 0;
      }
      else {
        (this->tok).j = pTVar5->j;
        iVar3 = (pTVar5->pos).line;
        uVar12 = *(undefined8 *)&(pTVar5->pos).col;
        pTVar1->kind = pTVar5->kind;
        (pTVar1->pos).line = iVar3;
        *(undefined8 *)&(this->tok).pos.col = uVar12;
        (this->tok_it)._M_current = pTVar5 + 1;
      }
      if (pTVar1->kind != Identifier) {
        error<char_const(&)[30]>(this,(char (*) [30])"expecting identifier after ::");
      }
      puVar8 = (this->data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_f0._0_8_ = paVar10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)local_f0,puVar8 + (this->tok).i,puVar8 + (this->tok).j);
      std::__cxx11::string::_M_append((char *)&local_118,local_f0._0_8_);
    }
    do {
      TVar11 = pTVar1->kind;
      if (TVar11 == Punctuator) {
        if ((((this->tok).i - 0x26U & 0xfffffffb) != 0) || ((this->tok).j != 0)) goto LAB_00108023;
      }
      else {
        if (TVar11 == Eof) goto LAB_00108038;
LAB_00108023:
        if ((TVar11 != Keyword) || ((this->tok).i != 0x11)) goto LAB_00108033;
      }
      if (TVar11 == Keyword) {
        std::__cxx11::string::push_back((char)&local_118);
        std::__cxx11::string::_M_append
                  ((char *)&local_118,
                   (ulong)keywords_id_abi_cxx11_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(this->tok).i]._M_dataplus._M_p)
        ;
      }
      else {
        std::__cxx11::string::push_back((char)&local_118);
      }
      pTVar5 = (this->tok_it)._M_current;
      if (pTVar5 == (this->tok_end)._M_current) {
        pTVar1->kind = Eof;
        pTVar2->line = 0;
        pTVar2->col = 0;
        (this->tok).i = 0;
        (this->tok).j = 0;
      }
      else {
        (this->tok).j = pTVar5->j;
        iVar3 = (pTVar5->pos).line;
        uVar12 = *(undefined8 *)&(pTVar5->pos).col;
        pTVar1->kind = pTVar5->kind;
        (pTVar1->pos).line = iVar3;
        *(undefined8 *)&(this->tok).pos.col = uVar12;
        (this->tok_it)._M_current = pTVar5 + 1;
      }
    } while( true );
  }
  if (TVar11 != Keyword) goto LAB_00107be4;
  switch((this->tok).i) {
  case 3:
  case 4:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0x11:
  case 0x14:
  case 0x15:
  case 0x1b:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x23:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x34:
  case 0x38:
  case 0x39:
  case 0x3b:
  case 0x40:
  case 0x42:
  case 0x46:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
    pTVar5 = (this->tok_it)._M_current;
    if (pTVar5 == pTVar6) {
      pTVar1->kind = Eof;
      pTVar2->line = 0;
      pTVar2->col = 0;
      (this->tok).i = 0;
      (this->tok).j = 0;
    }
    else {
      (this->tok).j = pTVar5->j;
      iVar3 = (pTVar5->pos).line;
      uVar12 = *(undefined8 *)&(pTVar5->pos).col;
      pTVar1->kind = pTVar5->kind;
      (pTVar1->pos).line = iVar3;
      *(undefined8 *)&(this->tok).pos.col = uVar12;
      (this->tok_it)._M_current = pTVar5 + 1;
    }
    iVar3 = (this->tok).i;
    iVar4 = (this->tok).j;
    if ((this->tok).kind != Identifier) {
      error<char_const(&)[21]>(this,(char (*) [21])"expecting identifier");
    }
    pLVar7 = this->data;
    puVar8 = (pLVar7->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)&local_118,puVar8 + iVar3,puVar8 + iVar4);
    make_section((DocSection *)local_f0,pLVar7,&local_48,&local_118,
                 keywords_id_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (this->tok).i);
    std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::emplace_back<docs::DocSection>
              (&local_f8->sections,(DocSection *)local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
LAB_00107d9b:
      operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
    }
    break;
  default:
    goto switchD_00107c10_caseD_5;
  case 0xc:
  case 0x1e:
  case 0x2c:
  case 0x3e:
  case 0x49:
    pTVar5 = (this->tok_it)._M_current;
    if (pTVar5 == pTVar6) {
      pTVar1->kind = Eof;
      pTVar2->line = 0;
      pTVar2->col = 0;
      (this->tok).i = 0;
      (this->tok).j = 0;
    }
    else {
      (this->tok).j = pTVar5->j;
      iVar3 = (pTVar5->pos).line;
      iVar4 = (pTVar5->pos).col;
      iVar9 = pTVar5->i;
      pTVar1->kind = pTVar5->kind;
      (this->tok).pos.line = iVar3;
      (this->tok).pos.col = iVar4;
      (this->tok).i = iVar9;
      (this->tok_it)._M_current = pTVar5 + 1;
    }
    if (pTVar1->kind != Identifier) {
      local_f0._0_8_ =
           keywords_id_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(this->tok).i]._M_dataplus._M_p;
      error<char_const(&)[30],char_const*>
                (this,(char (*) [30])"expecting identifier after %s",(char **)local_f0);
      goto switchD_00107c10_caseD_5;
    }
    pLVar7 = this->data;
    puVar8 = (pLVar7->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)&local_118,puVar8 + (this->tok).i,puVar8 + (this->tok).j);
    make_section((DocSection *)local_f0,pLVar7,&local_48,&local_118,
                 keywords_id_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (this->tok).i);
    std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::emplace_back<docs::DocSection>
              (&local_f8->sections,(DocSection *)local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) goto LAB_00107d9b;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  uVar12 = local_d8._M_allocated_capacity;
  _Var13._M_p = (pointer)local_f0._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._8_8_ != &local_d8) goto LAB_0010814d;
  goto LAB_00108155;
LAB_00108033:
  if (TVar11 != Identifier) {
LAB_00108038:
    local_f0._0_8_ = local_118._M_dataplus._M_p;
    error<char_const(&)[35],char_const*>
              (this,(char (*) [35])"expecting identifier after type %s",(char **)local_f0);
  }
  puVar8 = (this->data->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((string *)&local_68,puVar8 + (this->tok).i,puVar8 + (this->tok).j);
  make_section((DocSection *)local_f0,this->data,&local_48,&local_68,&local_118);
  std::vector<docs::DocSection,_std::allocator<docs::DocSection>_>::emplace_back<docs::DocSection>
            (&local_f8->sections,(DocSection *)local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._8_8_ != &local_d8) {
    operator_delete((void *)local_f0._8_8_,local_d8._M_allocated_capacity + 1);
  }
  uVar12 = local_68.field_2._M_allocated_capacity;
  _Var13._M_p = local_68._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0010814d:
    operator_delete(_Var13._M_p,uVar12 + 1);
  }
LAB_00108155:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  goto switchD_00107c10_caseD_5;
}

Assistant:

void createDoc(Doc& doc) {
    while (next_token().kind != TokenKind::Eof) {
      // Discard tokens until we find a comment, which might be
      // included in the docs.
      if (!is(TokenKind::Comment))
        continue;

      Token commentTok = tok;
      tok = next_token();
      if (eof()) // end of tokens (a comment at the end of file, maybe commenting the file?)
        break;

      switch (tok.kind) {
        case TokenKind::Keyword:
          switch (tok.i) {
            // Structures and namespaces
            case key_class:
            case key_struct:
            case key_enum:
            case key_union:
            case key_namespace: {
              Token idTok = next_token();
              if (!is(TokenKind::Identifier)) {
                error("expecting identifier after %s",
                      keywords_id[int(tok.i)].c_str());
                break;
              }

              doc.sections.push_back(
                make_section(data, commentTok,
                             data.id_text(idTok),
                             keywords_id[int(tok.i)]));
              break;
            }
              // Variables or functions
            case key_auto:
            case key_bool:
            case key_char:
            case key_char16_t:
            case key_char32_t:
            case key_char8_t:
            case key_const:
            case key_constexpr:
            case key_constinit:
            case key_double:
            case key_explicit:
            case key_export:
            case key_extern:
            case key_float:
            case key_inline:
            case key_int:
            case key_long:
            case key_mutable:
            case key_register:
            case key_short:
            case key_signed:
            case key_static:
            case key_template:
            case key_thread_local:
            case key_typedef:
            case key_unsigned:
            case key_using:
            case key_virtual:
            case key_void:
            case key_volatile:
            case key_wchar_t: {
              Token id_tok = next_token();
              if (!is(TokenKind::Identifier))
                error("expecting identifier");

              doc.sections.push_back(
                make_section(data, commentTok,
                             data.id_text(id_tok),
                             keywords_id[int(tok.i)]));
              break;
            }
          }
          break;
          // A user defined type to define a return value of a function or a variable type
        case TokenKind::Identifier: {
          Token firstTok = tok;
          std::string type;

          // TODO types that start with "const" go to the keyword
          //      case, or with "::" go to punctuator case

          tok = next_token();
          if (tok.is_double_colon()) {
            type += "::";
            tok = next_token();
          }

          if (!is(TokenKind::Identifier))
            error("expecting identifier");

          type += data.id_text(tok);
          next_token();

          while (tok.is_double_colon()) {
            type += "::";
            next_token();
            if (!is(TokenKind::Identifier))
              error("expecting identifier after ::");

            type += data.id_text(tok);
            next_token();
          }

          while (!eof() &&
                 // Pointers and references
                 ((is(TokenKind::Punctuator) &&
                   ((tok.i == '*' && tok.j == 0) ||
                    (tok.i == '&' && tok.j == 0)))
                  ||
                  // const
                  (tok.is_const_keyword()))) {
            if (is(TokenKind::Keyword)) {
              type.push_back(' ');
              type += keywords_id[tok.i];
            }
            else
              type.push_back(tok.i); // Add '*' or '&'
            next_token();
          }

          if (!is(TokenKind::Identifier))
            error("expecting identifier after type %s", type.c_str());

          std::string id(data.id_text(tok));

          doc.sections.push_back(
            make_section(data, commentTok, id, type));
          break;
        }
      }
    }
  }